

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O3

char * __thiscall Fl_Type::class_name(Fl_Type *this,int need_nest)

{
  int iVar1;
  char *src;
  
  do {
    this = this->parent;
    if (this == (Fl_Type *)0x0) {
      return (char *)0x0;
    }
    iVar1 = (*this->_vptr_Fl_Type[0x26])(this);
  } while (iVar1 == 0);
  if ((need_nest != 0) && (src = class_name(this,need_nest), src != (char *)0x0)) {
    if (src != class_name::s) {
      fl_strlcpy(class_name::s,src,0x100);
    }
    fl_strlcat(class_name::s,"::",0x100);
    fl_strlcat(class_name::s,this->name_,0x100);
    return class_name::s;
  }
  return this->name_;
}

Assistant:

const char* Fl_Type::class_name(const int need_nest) const {
  Fl_Type* p = parent;
  while (p) {
    if (p->is_class()) {
      // see if we are nested in another class, we must fully-qualify name:
      // this is lame but works...
      const char* q = 0;
      if(need_nest) q=p->class_name(need_nest);
      if (q) {
	static char s[256];
	if (q != s) strlcpy(s, q, sizeof(s));
	strlcat(s, "::", sizeof(s));
	strlcat(s, p->name(), sizeof(s));
	return s;
      }
      return p->name();
    }
    p = p->parent;
  }
  return 0;
}